

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# LRUCache.hpp
# Opt level: O1

stationNameType * __thiscall
sjtu::LRUCache<sjtu::TrainManager::stationNameType>::load
          (LRUCache<sjtu::TrainManager::stationNameType> *this,locType *offset)

{
  Node *pNVar1;
  long lVar2;
  CacheNode *pCVar3;
  Node *pNVar4;
  CacheNode *pCVar5;
  CacheNode *pCVar6;
  CacheNode **ppCVar7;
  stationNameType ret;
  undefined8 local_69;
  undefined8 uStack_61;
  undefined8 local_59;
  undefined1 uStack_51;
  undefined7 uStack_50;
  undefined1 uStack_49;
  undefined8 uStack_48;
  value_type local_40;
  pair<sjtu::map<long,_sjtu::LRUCache<sjtu::TrainManager::stationNameType>::CacheNode_*,_std::less<long>_>::iterator,_bool>
  local_30;
  
  this->attempt_count = this->attempt_count + 1;
  pNVar1 = (this->table).nil;
  pNVar4 = pNVar1->left;
  if (pNVar4 != pNVar1) {
    do {
      lVar2 = pNVar4->value->first;
      if (lVar2 == *offset) break;
      pNVar4 = (&pNVar4->left)[lVar2 <= *offset];
    } while (pNVar4 != pNVar1);
  }
  if (pNVar4 == pNVar1) {
    this->miss_count = this->miss_count + 1;
    pCVar5 = (CacheNode *)operator_new(0x58);
    std::istream::seekg(this->file,*offset,0);
    std::istream::read((char *)this->file,(long)&local_69);
    *(ulong *)((pCVar5->value).name + 0x19) = CONCAT17(uStack_49,uStack_50);
    *(undefined8 *)((pCVar5->value).name + 0x21) = uStack_48;
    *(undefined8 *)((pCVar5->value).name + 0x10) = local_59;
    *(ulong *)((pCVar5->value).name + 0x18) = CONCAT71(uStack_50,uStack_51);
    *(undefined8 *)(pCVar5->value).name = local_69;
    *(undefined8 *)((pCVar5->value).name + 8) = uStack_61;
    local_40.first = *offset;
    pCVar5->offset = local_40.first;
    pCVar5->is_dirty_page = false;
    pCVar5->prec = (CacheNode *)0x0;
    pCVar5->succ = (CacheNode *)0x0;
    pCVar5->bel = this;
    local_40.second = pCVar5;
    map<long,_sjtu::LRUCache<sjtu::TrainManager::stationNameType>::CacheNode_*,_std::less<long>_>::
    insert(&local_30,&this->table,&local_40);
    if (this->block_lim == (this->table).tot) {
      pCVar6 = this->tail;
      pCVar3 = pCVar6->prec;
      this->tail = pCVar3;
      ppCVar7 = &pCVar3->succ;
      if (pCVar3 == (CacheNode *)0x0) {
        ppCVar7 = &this->head;
      }
      *ppCVar7 = (CacheNode *)0x0;
      if (pCVar6 != (CacheNode *)0x0) {
        CacheNode::~CacheNode(pCVar6);
        operator_delete(pCVar6,0x58);
      }
    }
    pCVar6 = this->head;
    if (pCVar6 == (CacheNode *)0x0) {
      this->tail = pCVar5;
      goto LAB_00118870;
    }
  }
  else {
    pCVar5 = pNVar4->value->second;
    pCVar6 = this->head;
    if (pCVar5 == pCVar6) {
      return &pCVar5->value;
    }
    pCVar3 = pCVar5->prec;
    pCVar3->succ = pCVar5->succ;
    ppCVar7 = &pCVar5->succ->prec;
    if (pCVar5->succ == (CacheNode *)0x0) {
      ppCVar7 = &this->tail;
    }
    *ppCVar7 = pCVar3;
    pCVar5->prec = (CacheNode *)0x0;
  }
  pCVar5->succ = pCVar6;
  pCVar6->prec = pCVar5;
LAB_00118870:
  this->head = pCVar5;
  return &pCVar5->value;
}

Assistant:

valueType *load(const locType &offset)
		{
			++ attempt_count;
			typename map<locType , CacheNode*>::iterator it = table.find(offset);
			CacheNode *node;
			if (it == table.end())
			{
				++ miss_count;
				node = new CacheNode (f_read(offset) , offset , this);
				if (block_lim == table.size())
				{
					CacheNode *tmp = tail;
					if (tail = tail -> prec) tail -> succ = nullptr;
					else  head = nullptr;
					delete tmp;
				}
				if (head == nullptr) head = tail = node;
				else (node -> succ = head) -> prec = node , head = node;
			}
			else
			{
				node = it -> second;
				if (node != head)
				{
					node -> prec -> succ = node -> succ;
					if (node -> succ) node -> succ -> prec = node -> prec;
					else tail = node -> prec;
					node -> prec = nullptr , (node -> succ = head) -> prec = node , head = node;
				}
			}
			return &(node -> value);
		}